

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O0

void obuf_destroy(obuf *buf)

{
  slab *slab_00;
  slab *slab;
  int i;
  obuf *buf_local;
  
  for (slab._4_4_ = 0; slab._4_4_ < buf->n_iov; slab._4_4_ = slab._4_4_ + 1) {
    slab_00 = slab_from_data(buf->iov[slab._4_4_].iov_base);
    slab_put(buf->slabc,slab_00);
  }
  memset(buf,0,0x328);
  return;
}

Assistant:

void
obuf_destroy(struct obuf *buf)
{
	int i;
	for (i = 0; i < buf->n_iov; i++) {
		struct slab *slab = slab_from_data(buf->iov[i].iov_base);
		slab_put(buf->slabc, slab);
	}
	/* Safety and also makes obuf_is_initialized work. */
	memset(buf, 0, sizeof(*buf));
}